

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O2

unique_ptr<duckdb::Block,_std::default_delete<duckdb::Block>,_true> __thiscall
duckdb::SingleFileBlockManager::CreateBlock
          (SingleFileBlockManager *this,block_id_t block_id,FileBuffer *source_buffer)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  Allocator *args;
  pointer this_00;
  long in_RCX;
  _func_int **local_20;
  FileBuffer *local_18;
  
  (this->super_BlockManager)._vptr_BlockManager = (_func_int **)0x0;
  local_18 = source_buffer;
  if (in_RCX == 0) {
    args = Allocator::Get(*(AttachedDatabase **)(block_id + 0x88));
    make_uniq<duckdb::Block,duckdb::Allocator&,long&,duckdb::SingleFileBlockManager&>
              ((duckdb *)&local_20,args,(long *)&local_18,(SingleFileBlockManager *)block_id);
  }
  else {
    (**(code **)(*(long *)block_id + 0x10))(&local_20,block_id);
  }
  pp_Var2 = local_20;
  local_20 = (_func_int **)0x0;
  pp_Var1 = (this->super_BlockManager)._vptr_BlockManager;
  (this->super_BlockManager)._vptr_BlockManager = pp_Var2;
  if (pp_Var1 != (_func_int **)0x0) {
    (**(code **)(*pp_Var1 + 8))();
    if (local_20 != (_func_int **)0x0) {
      (**(code **)(*local_20 + 8))();
    }
  }
  this_00 = unique_ptr<duckdb::Block,_std::default_delete<duckdb::Block>,_true>::operator->
                      ((unique_ptr<duckdb::Block,_std::default_delete<duckdb::Block>,_true> *)this);
  FileBuffer::Initialize(&this_00->super_FileBuffer,*(DebugInitialize *)(block_id + 0x1ea));
  return (unique_ptr<duckdb::Block,_std::default_delete<duckdb::Block>_>)
         (unique_ptr<duckdb::Block,_std::default_delete<duckdb::Block>_>)this;
}

Assistant:

unique_ptr<Block> SingleFileBlockManager::CreateBlock(block_id_t block_id, FileBuffer *source_buffer) {
	unique_ptr<Block> result;
	if (source_buffer) {
		result = ConvertBlock(block_id, *source_buffer);
	} else {
		result = make_uniq<Block>(Allocator::Get(db), block_id, *this);
	}
	result->Initialize(options.debug_initialize);
	return result;
}